

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O3

void bsplib::serial<unsigned_long>(A2A *a2a,int pid,unsigned_long x)

{
  bool bVar1;
  size_t __n;
  ulong uVar2;
  Buffer buf;
  byte local_a [10];
  
  __n = 0;
  do {
    uVar2 = x & 0xffffff7f;
    local_a[__n] = (0x7f < x) << 7 | (byte)uVar2;
    __n = __n + 1;
    bVar1 = 0x7f < x;
    x = x >> 7;
  } while (bVar1);
  A2A::send(a2a,pid,local_a,__n,(int)uVar2);
  return;
}

Assistant:

void serial( A2A & a2a, int pid, UInt x ) {
    typedef UIntSerialize< UInt > S;     
    typename S::Buffer buf;
    { const int n = S::write(x, buf );
      a2a.send( pid, buf, n );
    }
}